

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>::
encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>
           *this,int32_t x,int32_t ra,int32_t rb)

{
  default_traits<unsigned_char,_unsigned_char> *this_00;
  uchar uVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = ra - rb;
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  this_00 = &this->traits_;
  iVar2 = (this->traits_).near_lossless;
  if (iVar2 < iVar3) {
    iVar6 = (uint)(ra <= rb) * 2 + -1;
    iVar5 = (x - rb) * iVar6;
    iVar3 = -iVar2;
    if (0 < iVar5) {
      iVar3 = iVar2;
    }
    iVar4 = default_traits<unsigned_char,_unsigned_char>::modulo_range
                      (this_00,(iVar3 + iVar5) / (iVar2 * 2 + 1));
    encode_run_interruption_error(this,(this->context_run_mode_)._M_elems,iVar4);
    iVar4 = ((this->traits_).near_lossless * 2 + 1) * iVar6 * iVar4 + rb;
  }
  else {
    iVar3 = -iVar2;
    if (0 < x - ra) {
      iVar3 = iVar2;
    }
    iVar4 = default_traits<unsigned_char,_unsigned_char>::modulo_range
                      (this_00,(iVar3 + (x - ra)) / (iVar2 * 2 + 1));
    encode_run_interruption_error(this,(this->context_run_mode_)._M_elems + 1,iVar4);
    iVar4 = ((this->traits_).near_lossless * 2 + 1) * iVar4 + ra;
  }
  uVar1 = default_traits<unsigned_char,_unsigned_char>::fix_reconstructed_value(this_00,iVar4);
  return uVar1;
}

Assistant:

sample_type encode_run_interruption_pixel(const int32_t x, const int32_t ra, const int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{traits_.compute_error_value(x - ra)};
            encode_run_interruption_error(context_run_mode_[1], error_value);
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{traits_.compute_error_value((x - rb) * sign(rb - ra))};
        encode_run_interruption_error(context_run_mode_[0], error_value);
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }